

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O1

fdb_compact_decision
cb_inmem_snap(fdb_file_handle *fhandle,fdb_compaction_status status,char *kv_name,fdb_doc *doc_in,
             uint64_t old_offset,uint64_t new_offset,void *ctx)

{
  size_t __n;
  size_t __n_00;
  size_t __n_01;
  void *pvVar1;
  long lVar2;
  void *pvVar3;
  fdb_doc *doc;
  fdb_status fVar4;
  int iVar5;
  size_t sVar6;
  size_t sVar7;
  fdb_iterator *doc_00;
  fdb_config *fconfig;
  fdb_config *pfVar8;
  size_t sVar9;
  fdb_kvs_handle *handle;
  fdb_config *pfVar10;
  fdb_config *doc_01;
  char *__format;
  fdb_iterator *pfVar11;
  fdb_config *unaff_R12;
  fdb_config *unaff_R13;
  long lVar12;
  ulong uVar13;
  fdb_kvs_handle *pfVar14;
  fdb_doc **doc_02;
  fdb_iterator *config;
  fdb_iterator *fit;
  fdb_kvs_handle *snap;
  size_t valuelen;
  void *value_out;
  fdb_kvs_info info;
  timeval __test_begin;
  char value [256];
  char key [256];
  fdb_doc *pfStack_890;
  fdb_iterator *pfStack_888;
  int iStack_87c;
  fdb_kvs_handle *pfStack_878;
  timeval tStack_870;
  fdb_config *pfStack_860;
  fdb_config *pfStack_858;
  fdb_config *pfStack_850;
  fdb_config *pfStack_848;
  fdb_iterator *pfStack_840;
  fdb_iterator *pfStack_838;
  fdb_kvs_handle *pfStack_828;
  fdb_config *pfStack_820;
  undefined1 auStack_818 [24];
  fdb_kvs_handle *pfStack_800;
  fdb_config *pfStack_7f8;
  fdb_kvs_handle *pfStack_7f0;
  fdb_kvs_handle *pfStack_7e8;
  undefined1 auStack_7e0 [80];
  undefined8 auStack_790 [5];
  fdb_doc *apfStack_768 [6];
  fdb_kvs_info fStack_738;
  timeval tStack_708;
  undefined1 auStack_6f8 [280];
  fdb_iterator fStack_5e0;
  fdb_config fStack_4e0;
  fdb_config fStack_3e0;
  fdb_kvs_handle *pfStack_2e8;
  fdb_config *pfStack_2e0;
  fdb_config *pfStack_2d8;
  fdb_config *pfStack_2d0;
  fdb_kvs_handle *pfStack_2c8;
  code *pcStack_2c0;
  fdb_config *local_2b0;
  fdb_iterator *local_2a8;
  fdb_kvs_handle *local_2a0;
  fdb_kvs_handle *local_298;
  fdb_kvs_handle *local_290;
  size_t local_288;
  fdb_kvs_handle *local_280;
  fdb_kvs_info local_278;
  undefined1 local_248 [14];
  undefined2 uStack_23a;
  fdb_config fStack_238;
  uint16_t local_138;
  undefined2 uStack_136;
  uint32_t uStack_134;
  
  uVar13 = (ulong)status;
  pfVar14 = (fdb_kvs_handle *)0x0;
  pcStack_2c0 = (code *)0x1135b8;
  gettimeofday((timeval *)local_248,(__timezone_ptr_t)0x0);
  if (status != 2) goto LAB_00113a23;
  if (kv_name == (char *)0x0) goto LAB_00113ad8;
  pfVar14 = (fdb_kvs_handle *)(ulong)doc_in->deleted;
  iVar5 = *(int *)((long)ctx + 0xc);
  *(int *)((long)ctx + 0xc) = iVar5 + 1;
  kv_name = (char *)ctx;
  if (iVar5 != 4) {
    if (iVar5 != 1) goto LAB_00113a23;
    pcStack_2c0 = (code *)0x113607;
    fVar4 = fdb_snapshot_open(*ctx,&local_2a0,0xffffffffffffffff);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113add;
    pcStack_2c0 = (code *)0x11361e;
    fVar4 = fdb_get_kvs_info(local_2a0,&local_278);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113ae7;
    doc_in = (fdb_doc *)((long)ctx + 8);
    if (local_278.last_seqnum != (long)*(int *)((long)ctx + 8)) {
      pcStack_2c0 = (code *)0x113a46;
      cb_inmem_snap();
    }
    pcStack_2c0 = (code *)0x113663;
    local_298 = pfVar14;
    local_290 = (fdb_kvs_handle *)doc_in;
    fVar4 = fdb_iterator_init(local_2a0,&local_2a8,(void *)0x0,0,(void *)0x0,0,0);
    if (fVar4 == FDB_RESULT_SUCCESS) {
      kv_name = local_248 + 10;
      uVar13 = 0;
      do {
        local_2b0 = (fdb_config *)0x0;
        pcStack_2c0 = (code *)0x11369a;
        fVar4 = fdb_iterator_get(local_2a8,(fdb_doc **)&local_2b0);
        if (fVar4 != FDB_RESULT_SUCCESS) break;
        pcStack_2c0 = (code *)0x1136ba;
        sprintf((char *)&stack0xfffffffffffffec8,*(char **)((long)ctx + 0x18),uVar13);
        sVar9 = (size_t)*(int *)((long)ctx + 0x10);
        pcStack_2c0 = (code *)0x1136ce;
        memset(&fStack_238,0x78,sVar9);
        builtin_strncpy((char *)((long)&((fdb_config *)kv_name)->chunksize + sVar9),"<end",4);
        *(undefined2 *)((long)&uStack_23a + sVar9) = 0x3e;
        pcStack_2c0 = (code *)0x1136ee;
        sprintf((char *)&fStack_238,*(char **)((long)ctx + 0x20),uVar13);
        unaff_R13 = local_2b0;
        sVar9._0_2_ = local_2b0->chunksize;
        sVar9._2_2_ = *(undefined2 *)&local_2b0->field_0x2;
        sVar9._4_4_ = local_2b0->blocksize;
        doc_in = *(fdb_doc **)&local_2b0->seqtree_opt;
        pcStack_2c0 = (code *)0x113706;
        iVar5 = bcmp(doc_in,&stack0xfffffffffffffec8,sVar9);
        if (iVar5 != 0) {
          pcStack_2c0 = (code *)0x113a88;
          cb_inmem_snap();
LAB_00113a88:
          pcStack_2c0 = (code *)0x113a98;
          cb_inmem_snap();
          goto LAB_00113a98;
        }
        doc_in = *(fdb_doc **)&unaff_R13->multi_kv_instances;
        pcStack_2c0 = (code *)0x113721;
        iVar5 = bcmp(doc_in,&fStack_238,unaff_R13->wal_threshold);
        if (iVar5 != 0) goto LAB_00113a88;
        uVar13 = (ulong)((int)uVar13 + 1);
        pcStack_2c0 = (code *)0x113733;
        fdb_doc_free((fdb_doc *)unaff_R13);
        pcStack_2c0 = (code *)0x11373d;
        fVar4 = fdb_iterator_next(local_2a8);
      } while (fVar4 == FDB_RESULT_SUCCESS);
      if ((int)uVar13 != *(int *)&local_290->kvs_config) {
        pcStack_2c0 = (code *)0x113a64;
        cb_inmem_snap();
      }
      pcStack_2c0 = (code *)0x11375c;
      fVar4 = fdb_iterator_close(local_2a8);
      pfVar14 = local_298;
      if (fVar4 != FDB_RESULT_SUCCESS) {
        pcStack_2c0 = (code *)0x11376e;
        cb_inmem_snap();
        goto LAB_0011376e;
      }
LAB_00113a19:
      pcStack_2c0 = (code *)0x113a23;
      fdb_kvs_close(local_2a0);
LAB_00113a23:
      return (uint)pfVar14 & 0xff;
    }
    goto LAB_00113af1;
  }
LAB_0011376e:
  local_298 = pfVar14;
  doc_in = (fdb_doc *)&stack0xfffffffffffffec8;
  local_138 = 0x656e;
  uStack_136 = 0x5f77;
  uStack_134 = 0x79656b;
  unaff_R13 = &fStack_238;
  fStack_238.chunksize = 0x656e;
  fStack_238._2_2_ = 0x5f77;
  fStack_238.blocksize = 0x756c6176;
  fStack_238.buffercache_size._0_2_ = 0x65;
  pfVar14 = *(fdb_kvs_handle **)&((fdb_config *)kv_name)->chunksize;
  pcStack_2c0 = (code *)0x1137b0;
  sVar9 = strlen((char *)doc_in);
  unaff_R12 = (fdb_config *)(sVar9 + 1);
  pcStack_2c0 = (code *)0x1137bc;
  sVar9 = strlen((char *)unaff_R13);
  pcStack_2c0 = (code *)0x1137d1;
  fVar4 = fdb_set_kv(pfVar14,doc_in,(size_t)unaff_R12,unaff_R13,sVar9 + 1);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113ae2;
  pcStack_2c0 = (code *)0x1137ed;
  fVar4 = fdb_snapshot_open(*(fdb_kvs_handle **)&((fdb_config *)kv_name)->chunksize,&local_2a0,
                            0xffffffffffffffff);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113aec;
  pcStack_2c0 = (code *)0x113804;
  fVar4 = fdb_get_kvs_info(local_2a0,&local_278);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113af6;
  doc_in = (fdb_doc *)&((fdb_config *)kv_name)->buffercache_size;
  if (local_278.last_seqnum != (long)(int)((fdb_config *)kv_name)->buffercache_size + 1U) {
    pcStack_2c0 = (code *)0x113a58;
    cb_inmem_snap();
  }
  pcStack_2c0 = (code *)0x113842;
  fVar4 = fdb_iterator_init(local_2a0,&local_2a8,(void *)0x0,0,(void *)0x0,0,0);
  pfVar10 = (fdb_config *)kv_name;
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113afb;
  unaff_R12 = &fStack_238;
  uVar13 = 0;
  do {
    local_2b0 = (fdb_config *)0x0;
    pcStack_2c0 = (code *)0x113874;
    fVar4 = fdb_iterator_get(local_2a8,(fdb_doc **)&local_2b0);
    kv_name = (char *)local_2b0;
    if (fVar4 != FDB_RESULT_SUCCESS) break;
    if ((int)uVar13 < (int)*(uint64_t *)doc_in) {
      pcStack_2c0 = (code *)0x11389c;
      sprintf((char *)&stack0xfffffffffffffec8,*(char **)((long)ctx + 0x18),uVar13);
      sVar9 = (size_t)*(int *)((long)ctx + 0x10);
      pcStack_2c0 = (code *)0x1138b0;
      memset(unaff_R12,0x78,sVar9);
      *(undefined4 *)(local_248 + sVar9 + 10) = 0x646e653c;
      *(undefined2 *)((long)&uStack_23a + sVar9) = 0x3e;
      pcStack_2c0 = (code *)0x1138d5;
      sprintf((char *)unaff_R12,*(char **)((long)ctx + 0x20),uVar13);
      kv_name = (char *)local_2b0;
      sVar7._0_2_ = local_2b0->chunksize;
      sVar7._2_2_ = *(undefined2 *)&local_2b0->field_0x2;
      sVar7._4_4_ = local_2b0->blocksize;
      unaff_R13 = *(fdb_config **)&local_2b0->seqtree_opt;
      pcStack_2c0 = (code *)0x1138ec;
      iVar5 = bcmp(unaff_R13,&stack0xfffffffffffffec8,sVar7);
      if (iVar5 != 0) goto LAB_00113aa8;
      unaff_R13 = *(fdb_config **)&((fdb_config *)kv_name)->multi_kv_instances;
      pcStack_2c0 = (code *)0x113907;
      iVar5 = bcmp(unaff_R13,unaff_R12,((fdb_config *)kv_name)->wal_threshold);
      if (iVar5 != 0) goto LAB_00113ab8;
    }
    else {
      local_138 = 0x656e;
      uStack_136 = 0x5f77;
      uStack_134 = 0x79656b;
      fStack_238.chunksize = 0x656e;
      fStack_238._2_2_ = 0x5f77;
      fStack_238.blocksize = 0x756c6176;
      fStack_238.buffercache_size._0_2_ = 0x65;
      sVar6._0_2_ = local_2b0->chunksize;
      sVar6._2_2_ = *(undefined2 *)&local_2b0->field_0x2;
      sVar6._4_4_ = local_2b0->blocksize;
      unaff_R13 = *(fdb_config **)&local_2b0->seqtree_opt;
      pcStack_2c0 = (code *)0x113955;
      iVar5 = bcmp(unaff_R13,&stack0xfffffffffffffec8,sVar6);
      if (iVar5 != 0) goto LAB_00113ac8;
      unaff_R13 = *(fdb_config **)&((fdb_config *)kv_name)->multi_kv_instances;
      pcStack_2c0 = (code *)0x113970;
      iVar5 = bcmp(unaff_R13,unaff_R12,((fdb_config *)kv_name)->wal_threshold);
      if (iVar5 != 0) goto LAB_00113a98;
    }
    uVar13 = (ulong)((int)uVar13 + 1);
    pcStack_2c0 = (code *)0x113984;
    fdb_doc_free((fdb_doc *)local_2b0);
    pcStack_2c0 = (code *)0x11398e;
    fVar4 = fdb_iterator_next(local_2a8);
    pfVar10 = (fdb_config *)kv_name;
  } while (fVar4 == FDB_RESULT_SUCCESS);
  if ((int)uVar13 != (int)*(uint64_t *)doc_in + 1) {
    pcStack_2c0 = (code *)0x113a73;
    cb_inmem_snap();
  }
  pcStack_2c0 = (code *)0x1139ac;
  fVar4 = fdb_iterator_close(local_2a8);
  pfVar14 = local_298;
  handle = local_2a0;
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113b00;
  pfVar10 = (fdb_config *)&stack0xfffffffffffffec8;
  pcStack_2c0 = (code *)0x1139ce;
  sVar9 = strlen((char *)pfVar10);
  pcStack_2c0 = (code *)0x1139e7;
  fVar4 = fdb_get_kv(handle,pfVar10,sVar9 + 1,&local_280,&local_288);
  if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00113b05;
  pcStack_2c0 = (code *)0x113a09;
  iVar5 = bcmp(local_280,&fStack_238,local_288);
  handle = local_280;
  if (iVar5 == 0) {
    pcStack_2c0 = (code *)0x113a19;
    fdb_free_block(local_280);
    goto LAB_00113a19;
  }
  goto LAB_00113b0a;
LAB_0011456a:
  pfStack_838 = (fdb_iterator *)0x114575;
  snapshot_clone_test();
  pfVar8 = fconfig;
LAB_00114575:
  fconfig = pfVar8;
  pfStack_838 = (fdb_iterator *)0x11457a;
  snapshot_clone_test();
LAB_0011457a:
  pfStack_838 = (fdb_iterator *)0x114585;
  snapshot_clone_test();
LAB_00114585:
  pfVar10 = (fdb_config *)&pfStack_820;
  pfStack_838 = (fdb_iterator *)0x114590;
  snapshot_clone_test();
  goto LAB_00114590;
LAB_00113a98:
  pcStack_2c0 = (code *)0x113aa8;
  cb_inmem_snap();
LAB_00113aa8:
  pcStack_2c0 = (code *)0x113ab8;
  cb_inmem_snap();
LAB_00113ab8:
  pcStack_2c0 = (code *)0x113ac8;
  cb_inmem_snap();
LAB_00113ac8:
  pfVar14 = (fdb_kvs_handle *)&stack0xfffffffffffffec8;
  unaff_R12 = &fStack_238;
  pcStack_2c0 = (code *)0x113ad8;
  cb_inmem_snap();
LAB_00113ad8:
  pcStack_2c0 = (code *)0x113add;
  cb_inmem_snap();
LAB_00113add:
  pcStack_2c0 = (code *)0x113ae2;
  cb_inmem_snap();
LAB_00113ae2:
  pcStack_2c0 = (code *)0x113ae7;
  cb_inmem_snap();
LAB_00113ae7:
  pcStack_2c0 = (code *)0x113aec;
  cb_inmem_snap();
LAB_00113aec:
  pcStack_2c0 = (code *)0x113af1;
  cb_inmem_snap();
LAB_00113af1:
  pcStack_2c0 = (code *)0x113af6;
  cb_inmem_snap();
LAB_00113af6:
  pcStack_2c0 = (code *)0x113afb;
  cb_inmem_snap();
  pfVar10 = (fdb_config *)kv_name;
LAB_00113afb:
  pcStack_2c0 = (code *)0x113b00;
  cb_inmem_snap();
LAB_00113b00:
  handle = (fdb_kvs_handle *)doc_in;
  pcStack_2c0 = (code *)0x113b05;
  cb_inmem_snap();
LAB_00113b05:
  pcStack_2c0 = (code *)0x113b0a;
  cb_inmem_snap();
LAB_00113b0a:
  pcStack_2c0 = snapshot_clone_test;
  cb_inmem_snap();
  pfStack_838 = (fdb_iterator *)0x113b3a;
  pfStack_2e8 = handle;
  pfStack_2e0 = unaff_R12;
  pfStack_2d8 = unaff_R13;
  pfStack_2d0 = pfVar10;
  pfStack_2c8 = pfVar14;
  pcStack_2c0 = (code *)uVar13;
  gettimeofday(&tStack_708,(__timezone_ptr_t)0x0);
  pfStack_838 = (fdb_iterator *)0x113b3f;
  memleak_start();
  pfStack_838 = (fdb_iterator *)0x113b4e;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fconfig = &fStack_3e0;
  pfStack_838 = (fdb_iterator *)0x113b5e;
  fdb_get_default_config();
  config = (fdb_iterator *)auStack_6f8;
  pfStack_838 = (fdb_iterator *)0x113b6e;
  fdb_get_default_kvs_config();
  fStack_3e0.buffercache_size = 0;
  fStack_3e0.wal_threshold = 0x400;
  fStack_3e0.seqtree_opt = '\x01';
  fStack_3e0.flags = 1;
  fStack_3e0.compaction_threshold = '\0';
  pfStack_838 = (fdb_iterator *)0x113b98;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar10 = (fdb_config *)(auStack_818 + 0x10);
  pfStack_838 = (fdb_iterator *)0x113baf;
  fVar4 = fdb_open((fdb_file_handle **)pfVar10,"./mvcc_test1",fconfig);
  doc_00 = (fdb_iterator *)(ulong)(uint)fVar4;
  pfStack_838 = (fdb_iterator *)0x113bc1;
  fdb_kvs_open_default((fdb_file_handle *)auStack_818._16_8_,&pfStack_828,(fdb_kvs_config *)config);
  if (fVar4 == FDB_RESULT_SUCCESS) {
    pfStack_838 = (fdb_iterator *)0x113bda;
    fVar4 = fdb_snapshot_open(pfStack_828,(fdb_kvs_handle **)(auStack_818 + 8),0);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00114595;
    pfStack_838 = (fdb_iterator *)0x113bf4;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_818._8_8_,&fStack_738);
    if ((fdb_config *)fStack_738.last_seqnum != (fdb_config *)0x0) {
      pfStack_838 = (fdb_iterator *)0x113c07;
      snapshot_clone_test();
    }
    pfVar10 = (fdb_config *)auStack_818;
    pfStack_838 = (fdb_iterator *)0x113c2a;
    fdb_iterator_init((fdb_kvs_handle *)auStack_818._8_8_,(fdb_iterator **)pfVar10,(void *)0x0,0,
                      (void *)0x0,0,0);
    pfStack_838 = (fdb_iterator *)0x113c32;
    fVar4 = fdb_iterator_next((fdb_iterator *)auStack_818._0_8_);
    pfVar8 = unaff_R12;
    if (fVar4 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011459a;
    pfStack_838 = (fdb_iterator *)0x113c45;
    fdb_iterator_close((fdb_iterator *)auStack_818._0_8_);
    pfStack_838 = (fdb_iterator *)0x113c4f;
    fdb_kvs_close((fdb_kvs_handle *)auStack_818._8_8_);
    lVar12 = 0;
    uVar13 = 0;
    do {
      pfStack_838 = (fdb_iterator *)0x113c71;
      sprintf(auStack_6f8 + 0x18,"key%d",uVar13 & 0xffffffff);
      pfStack_838 = (fdb_iterator *)0x113c8d;
      sprintf((char *)&fStack_5e0,"meta%d",uVar13 & 0xffffffff);
      pfStack_838 = (fdb_iterator *)0x113ca9;
      sprintf((char *)&fStack_4e0,"body%d",uVar13 & 0xffffffff);
      pfStack_838 = (fdb_iterator *)0x113cb9;
      sVar9 = strlen(auStack_6f8 + 0x18);
      pfStack_838 = (fdb_iterator *)0x113cc4;
      sVar6 = strlen((char *)&fStack_5e0);
      pfStack_838 = (fdb_iterator *)0x113ccf;
      sVar7 = strlen((char *)&fStack_4e0);
      pfStack_838 = (fdb_iterator *)0x113cf4;
      fdb_doc_create((fdb_doc **)(auStack_7e0 + lVar12),auStack_6f8 + 0x18,sVar9,&fStack_5e0,sVar6,
                     &fStack_4e0,sVar7);
      pfStack_838 = (fdb_iterator *)0x113d03;
      fdb_set(pfStack_828,*(fdb_doc **)(auStack_7e0 + uVar13 * 8));
      uVar13 = uVar13 + 1;
      lVar12 = lVar12 + 8;
    } while (uVar13 != 5);
    pfStack_838 = (fdb_iterator *)0x113d23;
    fdb_commit((fdb_file_handle *)auStack_818._16_8_,'\x01');
    uVar13 = 5;
    doc_02 = (fdb_doc **)(auStack_7e0 + 0x28);
    do {
      pfStack_838 = (fdb_iterator *)0x113d4a;
      sprintf(auStack_6f8 + 0x18,"key%d",uVar13 & 0xffffffff);
      pfStack_838 = (fdb_iterator *)0x113d66;
      sprintf((char *)&fStack_5e0,"meta%d",uVar13 & 0xffffffff);
      pfStack_838 = (fdb_iterator *)0x113d82;
      sprintf((char *)&fStack_4e0,"body%d",uVar13 & 0xffffffff);
      pfStack_838 = (fdb_iterator *)0x113d8a;
      sVar9 = strlen(auStack_6f8 + 0x18);
      pfStack_838 = (fdb_iterator *)0x113d95;
      sVar6 = strlen((char *)&fStack_5e0);
      pfStack_838 = (fdb_iterator *)0x113da0;
      sVar7 = strlen((char *)&fStack_4e0);
      pfStack_838 = (fdb_iterator *)0x113dc0;
      fdb_doc_create(doc_02,auStack_6f8 + 0x18,sVar9,&fStack_5e0,sVar6,&fStack_4e0,sVar7);
      pfStack_838 = (fdb_iterator *)0x113dcd;
      fdb_set(pfStack_828,*doc_02);
      uVar13 = uVar13 + 1;
      doc_02 = doc_02 + 1;
    } while (uVar13 != 9);
    fconfig = (fdb_config *)(auStack_6f8 + 0x18);
    pfStack_838 = (fdb_iterator *)0x113dfc;
    sprintf((char *)fconfig,"key%d",9);
    config = &fStack_5e0;
    pfStack_838 = (fdb_iterator *)0x113e1a;
    sprintf((char *)config,"meta%d",9);
    pfVar8 = &fStack_4e0;
    pfStack_838 = (fdb_iterator *)0x113e38;
    sprintf((char *)pfVar8,"Body%d",9);
    pfVar10 = (fdb_config *)(auStack_7e0 + 0x48);
    pfStack_838 = (fdb_iterator *)0x113e48;
    unaff_R13 = (fdb_config *)strlen((char *)fconfig);
    pfStack_838 = (fdb_iterator *)0x113e53;
    doc_00 = (fdb_iterator *)strlen((char *)config);
    pfStack_838 = (fdb_iterator *)0x113e5e;
    sVar9 = strlen((char *)pfVar8);
    pfStack_838 = (fdb_iterator *)0x113e79;
    fdb_doc_create((fdb_doc **)pfVar10,fconfig,(size_t)unaff_R13,config,(size_t)doc_00,pfVar8,sVar9)
    ;
    pfStack_838 = (fdb_iterator *)0x113e86;
    fdb_set(pfStack_828,(fdb_doc *)auStack_7e0._72_8_);
    pfStack_838 = (fdb_iterator *)0x113e92;
    fdb_commit((fdb_file_handle *)auStack_818._16_8_,'\0');
    **(undefined1 **)(auStack_7e0._72_8_ + 0x40) = 0x62;
    pfStack_838 = (fdb_iterator *)0x113ea9;
    fdb_set(pfStack_828,(fdb_doc *)auStack_7e0._72_8_);
    pfStack_838 = (fdb_iterator *)0x113eb5;
    fdb_commit((fdb_file_handle *)auStack_818._16_8_,'\0');
    pfStack_7f8 = *(fdb_config **)(auStack_7e0._72_8_ + 0x28);
    pfStack_838 = (fdb_iterator *)0x113ed7;
    fVar4 = fdb_snapshot_open(pfStack_828,&pfStack_7e8,0xffffffffffffffff);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_0011459f;
    pfStack_838 = (fdb_iterator *)0x113ef1;
    fdb_set(pfStack_828,(fdb_doc *)auStack_7e0._72_8_);
    pfStack_838 = (fdb_iterator *)0x113efd;
    fdb_commit((fdb_file_handle *)auStack_818._16_8_,'\0');
    uVar13 = 10;
    pfVar10 = (fdb_config *)0x50;
    do {
      pfStack_838 = (fdb_iterator *)0x113f24;
      sprintf(auStack_6f8 + 0x18,"key%d",uVar13 & 0xffffffff);
      pfStack_838 = (fdb_iterator *)0x113f40;
      sprintf((char *)&fStack_5e0,"meta%d",uVar13 & 0xffffffff);
      pfVar8 = &fStack_4e0;
      pfStack_838 = (fdb_iterator *)0x113f5c;
      sprintf((char *)pfVar8,"body%d",uVar13 & 0xffffffff);
      doc_00 = (fdb_iterator *)(auStack_7e0 + (long)pfVar10);
      pfStack_838 = (fdb_iterator *)0x113f6c;
      fconfig = (fdb_config *)strlen(auStack_6f8 + 0x18);
      pfStack_838 = (fdb_iterator *)0x113f77;
      unaff_R13 = (fdb_config *)strlen((char *)&fStack_5e0);
      pfStack_838 = (fdb_iterator *)0x113f82;
      sVar9 = strlen((char *)pfVar8);
      pfStack_838 = (fdb_iterator *)0x113fa7;
      fdb_doc_create((fdb_doc **)doc_00,auStack_6f8 + 0x18,(size_t)fconfig,&fStack_5e0,
                     (size_t)unaff_R13,pfVar8,sVar9);
      pfStack_838 = (fdb_iterator *)0x113fb6;
      fdb_set(pfStack_828,*(fdb_doc **)(auStack_7e0 + uVar13 * 8));
      uVar13 = uVar13 + 1;
      pfVar10 = (fdb_config *)((long)pfVar10 + 8);
    } while (uVar13 != 0xf);
    pfStack_838 = (fdb_iterator *)0x113fd6;
    fdb_commit((fdb_file_handle *)auStack_818._16_8_,'\x01');
    pfStack_838 = (fdb_iterator *)0x113fee;
    fVar4 = fdb_set_log_callback(pfStack_828,logCallbackFunc,"snapshot_clone_test");
    config = (fdb_iterator *)0xf;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001145a4;
    pfStack_838 = (fdb_iterator *)0x11400a;
    fVar4 = fdb_snapshot_open(pfStack_828,(fdb_kvs_handle **)(auStack_818 + 8),999999);
    fconfig = pfStack_7f8;
    if (fVar4 != FDB_RESULT_NO_DB_INSTANCE) goto LAB_001145a9;
    pfStack_838 = (fdb_iterator *)0x11402a;
    fVar4 = fdb_snapshot_open(pfStack_828,(fdb_kvs_handle **)(auStack_818 + 8),
                              (fdb_seqnum_t)pfStack_7f8);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001145ae;
    pfStack_838 = (fdb_iterator *)0x114044;
    fVar4 = fdb_snapshot_open((fdb_kvs_handle *)auStack_818._8_8_,&pfStack_800,(fdb_seqnum_t)fconfig
                             );
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001145b3;
    pfStack_838 = (fdb_iterator *)0x114056;
    fVar4 = fdb_kvs_close((fdb_kvs_handle *)auStack_818._8_8_);
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001145b8;
    pfStack_838 = (fdb_iterator *)0x114073;
    fdb_get_kvs_info(pfStack_800,&fStack_738);
    if ((fdb_config *)fStack_738.last_seqnum != fconfig) {
      pfStack_838 = (fdb_iterator *)0x114089;
      snapshot_clone_test();
    }
    uVar13 = 0xf;
    config = (fdb_iterator *)apfStack_768;
    do {
      pfStack_838 = (fdb_iterator *)0x1140b1;
      sprintf(auStack_6f8 + 0x18,"key%d",uVar13 & 0xffffffff);
      doc_00 = &fStack_5e0;
      pfStack_838 = (fdb_iterator *)0x1140cc;
      sprintf((char *)doc_00,"meta%d",uVar13 & 0xffffffff);
      fconfig = &fStack_4e0;
      pfStack_838 = (fdb_iterator *)0x1140e7;
      sprintf((char *)fconfig,"body%d",uVar13 & 0xffffffff);
      pfStack_838 = (fdb_iterator *)0x1140ef;
      pfVar8 = (fdb_config *)strlen(auStack_6f8 + 0x18);
      pfStack_838 = (fdb_iterator *)0x1140fa;
      unaff_R13 = (fdb_config *)strlen((char *)doc_00);
      pfStack_838 = (fdb_iterator *)0x114105;
      sVar9 = strlen((char *)fconfig);
      pfStack_838 = (fdb_iterator *)0x114125;
      fdb_doc_create((fdb_doc **)config,auStack_6f8 + 0x18,(size_t)pfVar8,doc_00,(size_t)unaff_R13,
                     fconfig,sVar9);
      pfStack_838 = (fdb_iterator *)0x114132;
      fdb_set(pfStack_828,*(fdb_doc **)config);
      uVar13 = uVar13 + 1;
      config = (fdb_iterator *)((long)config + 8);
    } while (uVar13 != 0x14);
    pfStack_838 = (fdb_iterator *)0x11414f;
    fdb_commit((fdb_file_handle *)auStack_818._16_8_,'\0');
    pfStack_838 = (fdb_iterator *)0x114165;
    fVar4 = fdb_snapshot_open(pfStack_7e8,&pfStack_7f0,0xffffffffffffffff);
    pfVar10 = (fdb_config *)0x14;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001145bd;
    pfVar10 = (fdb_config *)&pfStack_820;
    pfStack_838 = (fdb_iterator *)0x1141b0;
    fdb_doc_create((fdb_doc **)pfVar10,
                   (void *)(*(size_t **)
                             (auStack_7e0 + (((long)pfStack_7f8 << 0x20) + 0x100000000 >> 0x1d)))[4]
                   ,**(size_t **)(auStack_7e0 + (((long)pfStack_7f8 << 0x20) + 0x100000000 >> 0x1d))
                   ,(void *)0x0,0,(void *)0x0,0);
    pfStack_838 = (fdb_iterator *)0x1141bd;
    fVar4 = fdb_get_metaonly(pfStack_800,(fdb_doc *)pfStack_820);
    if (fVar4 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001145c2;
    pfStack_838 = (fdb_iterator *)0x1141d3;
    fdb_doc_free((fdb_doc *)pfStack_820);
    pfStack_838 = (fdb_iterator *)0x1141f7;
    fdb_doc_create((fdb_doc **)&pfStack_820,*(void **)(auStack_7e0._40_8_ + 0x20),
                   *(size_t *)(uint16_t *)auStack_7e0._40_8_,(void *)0x0,0,(void *)0x0,0);
    pfStack_838 = (fdb_iterator *)0x114204;
    fVar4 = fdb_get_metaonly(pfStack_800,(fdb_doc *)pfStack_820);
    unaff_R12 = (fdb_config *)auStack_7e0._40_8_;
    doc_01 = pfStack_820;
    pfVar10 = (fdb_config *)&pfStack_820;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001145c7;
    fconfig = *(fdb_config **)&pfStack_820->seqtree_opt;
    config = *(fdb_iterator **)(auStack_7e0._40_8_ + 0x20);
    pfStack_838 = (fdb_iterator *)0x11422e;
    iVar5 = bcmp(fconfig,config,*(size_t *)(uint16_t *)auStack_7e0._40_8_);
    if (iVar5 != 0) goto LAB_001145cc;
    fconfig = (fdb_config *)doc_01->compactor_sleep_duration;
    config = *(fdb_iterator **)((long)unaff_R12 + 0x38);
    pfStack_838 = (fdb_iterator *)0x11424f;
    iVar5 = bcmp(fconfig,config,*(uint64_t *)((long)unaff_R12 + 8));
    if (iVar5 != 0) goto LAB_001145d7;
    pfStack_838 = (fdb_iterator *)0x11425f;
    fdb_doc_free((fdb_doc *)doc_01);
    pfStack_838 = (fdb_iterator *)0x114280;
    fdb_doc_create((fdb_doc **)&pfStack_820,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
    pfStack_820->compaction_buf_maxsize = 6;
    pfStack_820->cleanup_cache_onclose = false;
    pfStack_820->compress_document_body = false;
    pfStack_820->compaction_mode = '\0';
    pfStack_820->compaction_threshold = '\0';
    pfStack_838 = (fdb_iterator *)0x114295;
    fVar4 = fdb_get_byseq(pfStack_800,(fdb_doc *)pfStack_820);
    pfVar10 = pfStack_820;
    doc_01 = (fdb_config *)&pfStack_820;
    if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_001145e2;
    __n._0_2_ = pfStack_820->chunksize;
    __n._2_2_ = *(undefined2 *)&pfStack_820->field_0x2;
    __n._4_4_ = pfStack_820->blocksize;
    fconfig = *(fdb_config **)&pfStack_820->seqtree_opt;
    config = *(fdb_iterator **)(auStack_7e0._40_8_ + 0x20);
    pfStack_838 = (fdb_iterator *)0x1142be;
    iVar5 = bcmp(fconfig,config,__n);
    unaff_R12 = (fdb_config *)auStack_7e0._40_8_;
    if (iVar5 != 0) goto LAB_001145e7;
    fconfig = *(fdb_config **)&pfVar10->multi_kv_instances;
    config = *(fdb_iterator **)(auStack_7e0._40_8_ + 0x40);
    pfStack_838 = (fdb_iterator *)0x1142de;
    iVar5 = bcmp(fconfig,config,pfVar10->wal_threshold);
    if (iVar5 != 0) goto LAB_001145f2;
    pfStack_838 = (fdb_iterator *)0x1142ee;
    fdb_doc_free((fdb_doc *)pfVar10);
    pfVar10 = (fdb_config *)&pfStack_820;
    pfStack_820 = (fdb_config *)0x0;
    unaff_R13 = (fdb_config *)0x0;
    pfStack_838 = (fdb_iterator *)0x11431d;
    fdb_iterator_init(pfStack_800,(fdb_iterator **)auStack_818,(void *)0x0,0,(void *)0x0,0,0);
    pfVar8 = fconfig;
    do {
      pfStack_838 = (fdb_iterator *)0x11432a;
      fVar4 = fdb_iterator_get((fdb_iterator *)auStack_818._0_8_,(fdb_doc **)pfVar10);
      fconfig = pfStack_820;
      if (fVar4 != FDB_RESULT_SUCCESS) {
LAB_0011454f:
        pfStack_838 = (fdb_iterator *)0x114554;
        snapshot_clone_test();
        fconfig = pfVar8;
LAB_00114554:
        pfStack_838 = (fdb_iterator *)0x11455f;
        snapshot_clone_test();
LAB_0011455f:
        pfStack_838 = (fdb_iterator *)0x11456a;
        snapshot_clone_test();
        goto LAB_0011456a;
      }
      __n_00._0_2_ = pfStack_820->chunksize;
      __n_00._2_2_ = *(undefined2 *)&pfStack_820->field_0x2;
      __n_00._4_4_ = pfStack_820->blocksize;
      config = *(fdb_iterator **)&pfStack_820->seqtree_opt;
      doc_00 = *(fdb_iterator **)(auStack_7e0 + (long)unaff_R13 * 8);
      unaff_R12 = (fdb_config *)doc_00->_seqnum;
      pfStack_838 = (fdb_iterator *)0x114352;
      iVar5 = bcmp(config,unaff_R12,__n_00);
      pfVar8 = fconfig;
      if (iVar5 != 0) {
        pfStack_838 = (fdb_iterator *)0x11454f;
        snapshot_clone_test();
        goto LAB_0011454f;
      }
      config = (fdb_iterator *)fconfig->compactor_sleep_duration;
      unaff_R12 = (fdb_config *)doc_00->tree_cursor_start;
      pfStack_838 = (fdb_iterator *)0x114371;
      iVar5 = bcmp(config,unaff_R12,fconfig->buffercache_size);
      if (iVar5 != 0) goto LAB_0011455f;
      config = *(fdb_iterator **)&fconfig->multi_kv_instances;
      unaff_R12 = (fdb_config *)doc_00->tree_cursor_prev;
      pfStack_838 = (fdb_iterator *)0x114390;
      iVar5 = bcmp(config,unaff_R12,fconfig->wal_threshold);
      if (iVar5 != 0) goto LAB_00114554;
      pfStack_838 = (fdb_iterator *)0x1143a0;
      fdb_doc_free((fdb_doc *)fconfig);
      pfStack_820 = (fdb_config *)0x0;
      unaff_R13 = (fdb_config *)((long)&unaff_R13->chunksize + 1);
      pfStack_838 = (fdb_iterator *)0x1143b6;
      pfVar11 = (fdb_iterator *)auStack_818._0_8_;
      fVar4 = fdb_iterator_next((fdb_iterator *)auStack_818._0_8_);
    } while (fVar4 == FDB_RESULT_SUCCESS);
    if ((int)unaff_R13 == 10) {
      pfStack_838 = (fdb_iterator *)0x1143d5;
      fdb_iterator_close((fdb_iterator *)auStack_818._0_8_);
      unaff_R13 = (fdb_config *)0x0;
      pfStack_838 = (fdb_iterator *)0x1143f6;
      fdb_iterator_init(pfStack_7f0,(fdb_iterator **)auStack_818,(void *)0x0,0,(void *)0x0,0,0);
      pfVar10 = (fdb_config *)&pfStack_820;
      do {
        pfStack_838 = (fdb_iterator *)0x114408;
        fVar4 = fdb_iterator_get((fdb_iterator *)auStack_818._0_8_,(fdb_doc **)pfVar10);
        fconfig = pfStack_820;
        if (fVar4 != FDB_RESULT_SUCCESS) goto LAB_00114575;
        __n_01._0_2_ = pfStack_820->chunksize;
        __n_01._2_2_ = *(undefined2 *)&pfStack_820->field_0x2;
        __n_01._4_4_ = pfStack_820->blocksize;
        config = *(fdb_iterator **)&pfStack_820->seqtree_opt;
        doc_00 = *(fdb_iterator **)(auStack_7e0 + (long)unaff_R13 * 8);
        unaff_R12 = (fdb_config *)doc_00->_seqnum;
        pfStack_838 = (fdb_iterator *)0x114430;
        iVar5 = bcmp(config,unaff_R12,__n_01);
        if (iVar5 != 0) goto LAB_0011456a;
        config = (fdb_iterator *)fconfig->compactor_sleep_duration;
        unaff_R12 = (fdb_config *)doc_00->tree_cursor_start;
        pfStack_838 = (fdb_iterator *)0x11444f;
        iVar5 = bcmp(config,unaff_R12,fconfig->buffercache_size);
        if (iVar5 != 0) goto LAB_00114585;
        config = *(fdb_iterator **)&fconfig->multi_kv_instances;
        unaff_R12 = (fdb_config *)doc_00->tree_cursor_prev;
        pfStack_838 = (fdb_iterator *)0x11446e;
        iVar5 = bcmp(config,unaff_R12,fconfig->wal_threshold);
        if (iVar5 != 0) goto LAB_0011457a;
        pfStack_838 = (fdb_iterator *)0x11447e;
        fdb_doc_free((fdb_doc *)fconfig);
        pfStack_820 = (fdb_config *)0x0;
        unaff_R13 = (fdb_config *)((long)&unaff_R13->chunksize + 1);
        pfStack_838 = (fdb_iterator *)0x114494;
        pfVar11 = (fdb_iterator *)auStack_818._0_8_;
        fVar4 = fdb_iterator_next((fdb_iterator *)auStack_818._0_8_);
        pfVar8 = fconfig;
      } while (fVar4 == FDB_RESULT_SUCCESS);
      if ((int)unaff_R13 == 10) {
        pfStack_838 = (fdb_iterator *)0x1144b0;
        fdb_iterator_close((fdb_iterator *)auStack_818._0_8_);
        pfStack_838 = (fdb_iterator *)0x1144ba;
        fdb_kvs_close(pfStack_828);
        pfStack_838 = (fdb_iterator *)0x1144c4;
        fdb_kvs_close(pfStack_7e8);
        pfStack_838 = (fdb_iterator *)0x1144ce;
        fdb_kvs_close(pfStack_7f0);
        pfStack_838 = (fdb_iterator *)0x1144d8;
        fdb_kvs_close(pfStack_800);
        pfStack_838 = (fdb_iterator *)0x1144e2;
        fdb_close((fdb_file_handle *)auStack_818._16_8_);
        lVar12 = 0;
        do {
          pfStack_838 = (fdb_iterator *)0x1144ee;
          fdb_doc_free(*(fdb_doc **)(auStack_7e0 + lVar12 * 8));
          lVar12 = lVar12 + 1;
        } while (lVar12 != 0x14);
        pfStack_838 = (fdb_iterator *)0x1144fc;
        fdb_shutdown();
        pfStack_838 = (fdb_iterator *)0x114501;
        memleak_end();
        __format = "%s PASSED\n";
        if (snapshot_clone_test()::__test_pass != '\0') {
          __format = "%s FAILED\n";
        }
        pfStack_838 = (fdb_iterator *)0x114532;
        iVar5 = fprintf(_stderr,__format,"snapshot clone test");
        return iVar5;
      }
      goto LAB_00114602;
    }
  }
  else {
LAB_00114590:
    pfStack_838 = (fdb_iterator *)0x114595;
    snapshot_clone_test();
LAB_00114595:
    pfStack_838 = (fdb_iterator *)0x11459a;
    snapshot_clone_test();
    pfVar8 = unaff_R12;
LAB_0011459a:
    pfStack_838 = (fdb_iterator *)0x11459f;
    snapshot_clone_test();
LAB_0011459f:
    pfStack_838 = (fdb_iterator *)0x1145a4;
    snapshot_clone_test();
LAB_001145a4:
    pfStack_838 = (fdb_iterator *)0x1145a9;
    snapshot_clone_test();
LAB_001145a9:
    pfStack_838 = (fdb_iterator *)0x1145ae;
    snapshot_clone_test();
LAB_001145ae:
    pfStack_838 = (fdb_iterator *)0x1145b3;
    snapshot_clone_test();
LAB_001145b3:
    pfStack_838 = (fdb_iterator *)0x1145b8;
    snapshot_clone_test();
LAB_001145b8:
    pfStack_838 = (fdb_iterator *)0x1145bd;
    snapshot_clone_test();
LAB_001145bd:
    pfStack_838 = (fdb_iterator *)0x1145c2;
    snapshot_clone_test();
LAB_001145c2:
    pfStack_838 = (fdb_iterator *)0x1145c7;
    snapshot_clone_test();
LAB_001145c7:
    unaff_R12 = pfVar8;
    doc_01 = pfVar10;
    pfStack_838 = (fdb_iterator *)0x1145cc;
    snapshot_clone_test();
LAB_001145cc:
    pfStack_838 = (fdb_iterator *)0x1145d7;
    snapshot_clone_test();
LAB_001145d7:
    pfStack_838 = (fdb_iterator *)0x1145e2;
    snapshot_clone_test();
LAB_001145e2:
    pfVar10 = doc_01;
    pfStack_838 = (fdb_iterator *)0x1145e7;
    snapshot_clone_test();
LAB_001145e7:
    pfStack_838 = (fdb_iterator *)0x1145f2;
    snapshot_clone_test();
LAB_001145f2:
    pfStack_838 = (fdb_iterator *)0x1145fd;
    pfVar11 = config;
    snapshot_clone_test();
  }
  pfStack_838 = (fdb_iterator *)0x114602;
  snapshot_clone_test();
LAB_00114602:
  pfStack_838 = (fdb_iterator *)snap_clone_thread;
  snapshot_clone_test();
  pfStack_890 = (fdb_doc *)0x0;
  pfVar14 = pfVar11->handle;
  iVar5 = *(int *)&pfVar11->seqtree_iterator;
  pfStack_860 = pfVar10;
  pfStack_858 = unaff_R12;
  pfStack_850 = unaff_R13;
  pfStack_848 = fconfig;
  pfStack_840 = config;
  pfStack_838 = doc_00;
  gettimeofday(&tStack_870,(__timezone_ptr_t)0x0);
  fVar4 = fdb_snapshot_open((fdb_kvs_handle *)pfVar11->hbtrie_iterator,&pfStack_878,
                            0xffffffffffffffff);
  if (fVar4 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x7d5);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x7d5,"void *snap_clone_thread(void *)");
  }
  lVar12 = 0;
  iStack_87c = iVar5;
  fdb_iterator_init(pfStack_878,&pfStack_888,(void *)0x0,0,(void *)0x0,0,0);
  do {
    fVar4 = fdb_iterator_get(pfStack_888,&pfStack_890);
    doc = pfStack_890;
    if (fVar4 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x7df);
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x7df,"void *snap_clone_thread(void *)");
    }
    pvVar1 = pfStack_890->key;
    lVar2 = *(long *)(&(pfVar14->kvs_config).create_if_missing + lVar12 * 8);
    pvVar3 = *(void **)(lVar2 + 0x20);
    iVar5 = bcmp(pvVar1,pvVar3,pfStack_890->keylen);
    if (iVar5 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x7e0);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x7e0,"void *snap_clone_thread(void *)");
    }
    pvVar1 = doc->body;
    pvVar3 = *(void **)(lVar2 + 0x40);
    iVar5 = bcmp(pvVar1,pvVar3,doc->bodylen);
    if (iVar5 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x7e1);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x7e1,"void *snap_clone_thread(void *)");
    }
    fdb_doc_free(doc);
    pfStack_890 = (fdb_doc *)0x0;
    lVar12 = lVar12 + 1;
    fVar4 = fdb_iterator_next(pfStack_888);
  } while (fVar4 == FDB_RESULT_SUCCESS);
  if (iStack_87c / 2 != (int)lVar12) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x7e9);
    __assert_fail("count==n/2",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x7e9,"void *snap_clone_thread(void *)");
  }
  fdb_iterator_close(pfStack_888);
  fdb_kvs_close(pfStack_878);
  pthread_exit((void *)0x0);
}

Assistant:

static fdb_compact_decision cb_inmem_snap(fdb_file_handle *fhandle,
                            fdb_compaction_status status,
                            const char *kv_name,
                            fdb_doc *doc_in, uint64_t old_offset,
                            uint64_t new_offset,
                            void *ctx)
{
    TEST_INIT();
    int c, idx;
    char key[256], value[256];
    void *value_out;
    size_t valuelen;
    fdb_kvs_handle *snap;
    fdb_kvs_info info;
    fdb_iterator *fit;
    fdb_doc *doc;
    fdb_status s;
    fdb_compact_decision ret = FDB_CS_KEEP_DOC;
    struct cb_inmem_snap_args *args = (struct cb_inmem_snap_args *)ctx;
    (void)args;

    if (status == FDB_CS_MOVE_DOC) {
        TEST_CHK(kv_name);
        if (doc_in->deleted) {
            ret = FDB_CS_DROP_DOC;
        }
        args->move_count++;
        if (args->move_count == 2) {
            // open in-memory snapshot
            s = fdb_snapshot_open(args->handle, &snap, FDB_SNAPSHOT_INMEM);
            TEST_CHK(s == FDB_RESULT_SUCCESS);

            s = fdb_get_kvs_info(snap, &info);
            TEST_CHK(s == FDB_RESULT_SUCCESS);
            TEST_CHK(info.last_seqnum == (fdb_seqnum_t)args->n);

            s = fdb_iterator_init(snap, &fit, NULL, 0, NULL, 0, 0x0);
            TEST_CHK(s == FDB_RESULT_SUCCESS);

            c = 0;
            do {
                doc = NULL;
                s = fdb_iterator_get(fit, &doc);
                if (s != FDB_RESULT_SUCCESS) {
                    break;
                }
                idx = c;
                sprintf(key, args->keystr, idx);
                memset(value, 'x', args->value_len);
                memcpy(value + args->value_len - 6, "<end>", 6);
                sprintf(value, args->valuestr, idx);
                TEST_CMP(doc->key, key, doc->keylen);
                TEST_CMP(doc->body, value, doc->bodylen);

                c++;
                fdb_doc_free(doc);
            } while (fdb_iterator_next(fit) == FDB_RESULT_SUCCESS);
            TEST_CHK(c == args->n);

            s = fdb_iterator_close(fit);
            TEST_CHK(s == FDB_RESULT_SUCCESS);

            fdb_kvs_close(snap);

        } else if (args->move_count == 5) {
            // insert new doc
            sprintf(key, "new_key");
            sprintf(value, "new_value");
            s = fdb_set_kv(args->handle, (void*)key, strlen(key)+1, (void*)value, strlen(value)+1);
            TEST_CHK(s == FDB_RESULT_SUCCESS);

            // open in-memory snapshot
            s = fdb_snapshot_open(args->handle, &snap, FDB_SNAPSHOT_INMEM);
            TEST_CHK(s == FDB_RESULT_SUCCESS);

            s = fdb_get_kvs_info(snap, &info);
            TEST_CHK(s == FDB_RESULT_SUCCESS);
            TEST_CHK(info.last_seqnum == (fdb_seqnum_t)args->n+1);

            s = fdb_iterator_init(snap, &fit, NULL, 0, NULL, 0, 0x0);
            TEST_CHK(s == FDB_RESULT_SUCCESS);

            c = 0;
            do {
                doc = NULL;
                s = fdb_iterator_get(fit, &doc);
                if (s != FDB_RESULT_SUCCESS) {
                    break;
                }
                if (c < args->n) {
                    idx = c;
                    sprintf(key, args->keystr, idx);
                    memset(value, 'x', args->value_len);
                    memcpy(value + args->value_len - 6, "<end>", 6);
                    sprintf(value, args->valuestr, idx);
                    TEST_CMP(doc->key, key, doc->keylen);
                    TEST_CMP(doc->body, value, doc->bodylen);
                } else {
                    // new document
                    sprintf(key, "new_key");
                    sprintf(value, "new_value");
                    TEST_CMP(doc->key, key, doc->keylen);
                    TEST_CMP(doc->body, value, doc->bodylen);
                }

                c++;
                fdb_doc_free(doc);
            } while (fdb_iterator_next(fit) == FDB_RESULT_SUCCESS);
            TEST_CHK(c == args->n + 1);

            s = fdb_iterator_close(fit);
            TEST_CHK(s == FDB_RESULT_SUCCESS);

            s = fdb_get_kv(snap, (void*)key, strlen(key)+1, &value_out, &valuelen);
            TEST_CHK(s == FDB_RESULT_SUCCESS);
            TEST_CMP(value_out, value, valuelen);
            fdb_free_block(value_out);

            fdb_kvs_close(snap);
        }
    }
    return ret;
}